

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::ShaderRenderCase::iterate(ShaderRenderCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *description;
  int height;
  Surface refImage;
  Surface resImage;
  QuadGrid quadGrid;
  Surface local_198;
  Surface local_180;
  QuadGrid local_168;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"ShaderRenderCase::iterate() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x1d8);
  dVar3 = (this->m_program->m_program).m_program;
  (**(code **)(lVar5 + 0x1680))(dVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = 0x80;
  if (*(int *)CONCAT44(extraout_var_00,iVar4) < 0x80) {
    iVar2 = *(int *)CONCAT44(extraout_var_00,iVar4);
  }
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var_01,iVar4) + 4);
  height = 0x70;
  if (iVar4 < 0x70) {
    height = iVar4;
  }
  iVar4 = 4;
  if (this->m_isVertexCase != false) {
    iVar4 = 0x40;
  }
  local_180.m_width = 0;
  local_180.m_height = 0;
  local_180.m_pixels.m_ptr = (void *)0x3f80000000000000;
  QuadGrid::QuadGrid(&local_168,iVar4,iVar2,height,(Vec4 *)&local_180,&this->m_userAttribTransforms,
                     &this->m_textures);
  tcu::Surface::Surface(&local_180,iVar2,height);
  render(this,&local_180,dVar3,&local_168);
  tcu::Surface::Surface(&local_198,iVar2,height);
  if (this->m_isVertexCase == true) {
    computeVertexReference(this,&local_198,&local_168);
  }
  else {
    computeFragmentReference(this,&local_198,&local_168);
  }
  bVar1 = tcu::fuzzyCompare(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,
                            "ComparisonResult","Image comparison result",&local_198,&local_180,0.05,
                            COMPARE_LOG_RESULT);
  (**(code **)(lVar5 + 0x1680))(0);
  description = "Fail";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,description);
  tcu::Surface::~Surface(&local_198);
  tcu::Surface::~Surface(&local_180);
  QuadGrid::~QuadGrid(&local_168);
  return STOP;
}

Assistant:

TestNode::IterateResult ShaderRenderCase::iterate(void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::iterate() begin");

	DE_ASSERT(m_program);
	deUint32 programID = m_program->getProgram();
	gl.useProgram(programID);

	// Create quad grid.
	IVec2 viewportSize = getViewportSize();
	int   width		   = viewportSize.x();
	int   height	   = viewportSize.y();

	// \todo [petri] Better handling of constCoords (render in multiple chunks, vary coords).
	QuadGrid quadGrid(m_isVertexCase ? GRID_SIZE : 4, width, height, Vec4(0.0f, 0.0f, 0.0f, 1.0f),
					  m_userAttribTransforms, m_textures);

	// Render result.
	Surface resImage(width, height);
	render(resImage, programID, quadGrid);

	// Compute reference.
	Surface refImage(width, height);
	if (m_isVertexCase)
		computeVertexReference(refImage, quadGrid);
	else
		computeFragmentReference(refImage, quadGrid);

	// Compare.
	bool testOk = compareImages(resImage, refImage, 0.05f);

	// De-initialize.
	gl.useProgram(0);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, testOk ? "Pass" : "Fail");
	return TestNode::STOP;
}